

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Transmitter_PDU::Transmitter_PDU(Transmitter_PDU *this)

{
  Transmitter_PDU *this_local;
  
  Radio_Communications_Header::Radio_Communications_Header(&this->super_Radio_Communications_Header)
  ;
  (this->super_Radio_Communications_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Transmitter_PDU_0032c168;
  DATA_TYPE::RadioEntityType::RadioEntityType(&this->m_RadioEntityType);
  this->m_ui16Padding1 = 0;
  DATA_TYPE::AntennaLocation::AntennaLocation(&this->m_AntennaLocation);
  this->m_ui16AntennaPatternLength = 0;
  DATA_TYPE::ModulationType::ModulationType(&this->m_ModulationType);
  DATA_TYPE::CryptoSystem::CryptoSystem(&this->m_CryptoSystem);
  this->m_ui8LengthOfModulationParam = '\0';
  this->m_ui16Padding2 = 0;
  this->m_ui8Padding3 = '\0';
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vModulationParams);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_vAntennaPattern);
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui8PDUType = '\x19';
  (this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength = 0x68;
  return;
}

Assistant:

Transmitter_PDU::Transmitter_PDU() :
    m_ui16Padding1( 0 ),
    m_ui16AntennaPatternLength( 0 ),
    m_ui8LengthOfModulationParam( 0 ),
    m_ui16Padding2( 0 ),
    m_ui8Padding3( 0 )
{
    m_ui8PDUType = Transmitter_PDU_Type;
    m_ui16PDULength = TRANSMITTER_PDU_SIZE;
}